

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlru_simple.cpp
# Opt level: O3

int main(void)

{
  _List_node_base *p_Var1;
  ostream *poVar2;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> hello;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> world;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> world_1
  ;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> nope;
  tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  cache;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_208;
  bool local_1e8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_1e0;
  bool local_1c0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_1b8;
  bool local_198;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_190;
  bool local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  unsigned_long local_e8;
  tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  local_e0;
  
  cappuccino::
  tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  ::tlru_cache(&local_e0,3,1.0);
  local_208._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x1;
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"Hello","");
  cappuccino::
  tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  ::insert(&local_e0,(milliseconds)0x36ee80,(unsigned_long *)&local_208,&local_108,insert_or_update)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  local_208._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x2;
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"World","");
  cappuccino::
  tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  ::insert(&local_e0,(milliseconds)0x6ddd00,(unsigned_long *)&local_208,&local_128,insert_or_update)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  local_208._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x3;
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"nope","");
  cappuccino::
  tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  ::insert(&local_e0,(milliseconds)0xa4cb80,(unsigned_long *)&local_208,&local_148,insert_or_update)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  local_1e0._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x1;
  cappuccino::
  tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  ::find((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&local_208,&local_e0,(unsigned_long *)&local_1e0,no);
  local_1b8._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x2;
  cappuccino::
  tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  ::find((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&local_1e0,&local_e0,(unsigned_long *)&local_1b8,no);
  if (local_1e8 == true) {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_208._M_value._M_dataplus._M_p,
                        local_208._M_value._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
    if (local_1c0 != false) {
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(char *)local_1e0._M_value._M_dataplus._M_p,
                          local_1e0._M_value._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"!",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if ((local_1c0 == true) &&
         (local_1c0 = false,
         local_1e0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_1e0._M_value + 0x10))) {
        operator_delete((void *)local_1e0._M_value._M_dataplus._M_p,local_1e0._16_8_ + 1);
      }
      if ((local_1e8 == true) &&
         (local_1e8 = false,
         local_208._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_208._M_value + 0x10))) {
        operator_delete((void *)local_208._M_value._M_dataplus._M_p,local_208._16_8_ + 1);
      }
      local_208._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x4;
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"Hola","");
      cappuccino::
      tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
      ::insert(&local_e0,(milliseconds)0x1b7740,(unsigned_long *)&local_208,&local_168,
               insert_or_update);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
      local_1e0._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x4;
      cappuccino::
      tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
      ::find((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_208,&local_e0,(unsigned_long *)&local_1e0,no);
      local_1b8._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x1;
      cappuccino::
      tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
      ::find((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_1e0,&local_e0,(unsigned_long *)&local_1b8,no);
      local_190._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x2;
      cappuccino::
      tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
      ::find((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_1b8,&local_e0,(unsigned_long *)&local_190,no);
      local_e8 = 3;
      cappuccino::
      tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
      ::find((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_190,&local_e0,&local_e8,no);
      if (local_1e8 == true) {
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_208._M_value._M_dataplus._M_p,
                            local_208._M_value._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      }
      if (local_1c0 == true) {
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_1e0._M_value._M_dataplus._M_p,
                            local_1e0._M_value._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      }
      if (local_198 == true) {
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_1b8._M_value._M_dataplus._M_p,
                            local_1b8._M_value._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      }
      if (local_170 == false) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Nope was LRU\'ed out of the cache.\n",0x22);
      }
      if (((local_170 & 1U) != 0) &&
         (local_170 = false,
         local_190._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_190._M_value + 0x10))) {
        operator_delete((void *)local_190._M_value._M_dataplus._M_p,local_190._16_8_ + 1);
      }
      if ((local_198 == true) &&
         (local_198 = false,
         local_1b8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_1b8._M_value + 0x10))) {
        operator_delete((void *)local_1b8._M_value._M_dataplus._M_p,local_1b8._16_8_ + 1);
      }
      if ((local_1c0 == true) &&
         (local_1c0 = false,
         local_1e0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_1e0._M_value + 0x10))) {
        operator_delete((void *)local_1e0._M_value._M_dataplus._M_p,local_1e0._16_8_ + 1);
      }
      if ((local_1e8 == true) &&
         (local_1e8 = false,
         local_208._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_208._M_value + 0x10))) {
        operator_delete((void *)local_208._M_value._M_dataplus._M_p,local_208._16_8_ + 1);
      }
      std::
      _Rb_tree<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::pair<const_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_unsigned_long>_>,_std::less<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_unsigned_long>_>_>
      ::~_Rb_tree(&local_e0.m_ttl_list._M_t);
      while (local_e0.m_lru_list.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl._M_node.super__List_node_base._M_next !=
             (_List_node_base *)&local_e0.m_lru_list) {
        p_Var1 = (local_e0.m_lru_list.
                  super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
                  super__List_node_base._M_next)->_M_next;
        operator_delete(local_e0.m_lru_list.
                        super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        _M_node.super__List_node_base._M_next,0x18);
        local_e0.m_lru_list.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        _M_node.super__List_node_base._M_next = p_Var1;
      }
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_e0.m_keyed_elements._M_h);
      std::
      vector<cappuccino::tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
      ::~vector(&local_e0.m_elements);
      return 0;
    }
  }
  std::__throw_bad_optional_access();
}

Assistant:

int main()
{
    using namespace std::chrono_literals;

    // Create a cache with up to 3 items.
    cappuccino::tlru_cache<uint64_t, std::string> cache{3};

    // Insert "hello", "world" with different TTLs.
    cache.insert(1h, 1, "Hello");
    cache.insert(2h, 2, "World");

    // Insert a third value to fill the cache.
    cache.insert(3h, 3, "nope");

    {
        // Grab hello and world, this update their LRU positions.
        auto hello = cache.find(1);
        auto world = cache.find(2);

        std::cout << hello.value() << ", " << world.value() << "!" << std::endl;
    }

    // Insert "hola", this will replace "nope" since its the oldest lru item,
    // nothing has expired at this time.
    cache.insert(30min, 4, "Hola");

    {
        auto hola  = cache.find(4); // "hola" was just inserted, it will be found
        auto hello = cache.find(1); // "hello" will also have a value, it is at the end of the lru list
        auto world = cache.find(2); // "world" is in the middle of our 3 lru list.
        auto nope  = cache.find(3); // "nope" was lru'ed when "hola" was inserted
                                    // since "hello" and "world were fetched

        if (hola.has_value())
        {
            std::cout << hola.value() << "\n";
        }

        if (hello.has_value())
        {
            std::cout << hello.value() << "\n";
        }

        if (world.has_value())
        {
            std::cout << world.value() << "\n";
        }

        if (!nope.has_value())
        {
            std::cout << "Nope was LRU'ed out of the cache.\n";
        }
    }

    return 0;
}